

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsequentialanimationgroup.cpp
# Opt level: O2

void __thiscall
QSequentialAnimationGroupPrivate::_q_uncontrolledAnimationFinished
          (QSequentialAnimationGroupPrivate *this)

{
  QObjectCompatProperty<QAbstractAnimationPrivate,_QAbstractAnimation::Direction,_&QAbstractAnimationPrivate::_qt_property_direction_offset,_&QAbstractAnimationPrivate::setDirection,_&QAbstractAnimationPrivate::emitDirectionChanged,_nullptr>
  *this_00;
  QObjectBindableProperty<QSequentialAnimationGroupPrivate,_QAbstractAnimation_*,_&QSequentialAnimationGroupPrivate::_qt_property_currentAnimation_offset,_nullptr>
  *this_01;
  QObject *this_02;
  int iVar1;
  parameter_type pVar2;
  pointer piVar3;
  parameter_type pQVar4;
  iterator iVar5;
  int iVar6;
  
  this_02 = (this->super_QAnimationGroupPrivate).super_QAbstractAnimationPrivate.
            super_QObjectPrivate.super_QObjectData.q_ptr;
  while ((this->actualDuration).d.size < (long)this->currentAnimationIndex + 1) {
    QList<int>::append(&this->actualDuration,-1);
  }
  this_01 = &this->currentAnimation;
  QObjectBindableProperty<QSequentialAnimationGroupPrivate,_QAbstractAnimation_*,_&QSequentialAnimationGroupPrivate::_qt_property_currentAnimation_offset,_nullptr>
  ::value(this_01);
  iVar1 = QAbstractAnimation::currentTime
                    ((QAbstractAnimation *)
                     (this->currentAnimation).super_QPropertyData<QAbstractAnimation_*>.val);
  iVar6 = this->currentAnimationIndex;
  piVar3 = QList<int>::data(&this->actualDuration);
  piVar3[iVar6] = iVar1;
  pQVar4 = QObjectBindableProperty<QSequentialAnimationGroupPrivate,_QAbstractAnimation_*,_&QSequentialAnimationGroupPrivate::_qt_property_currentAnimation_offset,_nullptr>
           ::value(this_01);
  QAnimationGroupPrivate::disconnectUncontrolledAnimation
            (&this->super_QAnimationGroupPrivate,pQVar4);
  this_00 = &(this->super_QAnimationGroupPrivate).super_QAbstractAnimationPrivate.direction;
  pVar2 = QObjectCompatProperty<QAbstractAnimationPrivate,_QAbstractAnimation::Direction,_&QAbstractAnimationPrivate::_qt_property_direction_offset,_&QAbstractAnimationPrivate::setDirection,_&QAbstractAnimationPrivate::emitDirectionChanged,_nullptr>
          ::value(this_00);
  if (pVar2 == Forward) {
    pQVar4 = QObjectBindableProperty<QSequentialAnimationGroupPrivate,_QAbstractAnimation_*,_&QSequentialAnimationGroupPrivate::_qt_property_currentAnimation_offset,_nullptr>
             ::value(this_01);
    iVar5 = QList<QAbstractAnimation_*>::end(&(this->super_QAnimationGroupPrivate).animations);
    if (pQVar4 == iVar5.i[-1]) goto LAB_0036c457;
  }
  pVar2 = QObjectCompatProperty<QAbstractAnimationPrivate,_QAbstractAnimation::Direction,_&QAbstractAnimationPrivate::_qt_property_direction_offset,_&QAbstractAnimationPrivate::setDirection,_&QAbstractAnimationPrivate::emitDirectionChanged,_nullptr>
          ::value(this_00);
  if ((pVar2 != Backward) || (this->currentAnimationIndex != 0)) {
    pVar2 = QObjectCompatProperty<QAbstractAnimationPrivate,_QAbstractAnimation::Direction,_&QAbstractAnimationPrivate::_qt_property_direction_offset,_&QAbstractAnimationPrivate::setDirection,_&QAbstractAnimationPrivate::emitDirectionChanged,_nullptr>
            ::value(this_00);
    if (pVar2 == Forward) {
      iVar6 = this->currentAnimationIndex + 1;
    }
    else {
      iVar6 = this->currentAnimationIndex + -1;
    }
    setCurrentAnimation(this,iVar6,false);
    return;
  }
LAB_0036c457:
  QAbstractAnimation::stop((QAbstractAnimation *)this_02);
  return;
}

Assistant:

void QSequentialAnimationGroupPrivate::_q_uncontrolledAnimationFinished()
{
    Q_Q(QSequentialAnimationGroup);
    Q_ASSERT(qobject_cast<QAbstractAnimation *>(q->sender()) == currentAnimation);

    // we trust the duration returned by the animation
    while (actualDuration.size() < (currentAnimationIndex + 1))
        actualDuration.append(-1);
    actualDuration[currentAnimationIndex] = currentAnimation->currentTime();

    disconnectUncontrolledAnimation(currentAnimation);

    if ((direction == QAbstractAnimation::Forward && currentAnimation == animations.last())
        || (direction == QAbstractAnimation::Backward && currentAnimationIndex == 0)) {
        // we don't handle looping of a group with undefined duration
        q->stop();
    } else if (direction == QAbstractAnimation::Forward) {
        // set the current animation to be the next one
        setCurrentAnimation(currentAnimationIndex + 1);
    } else {
        // set the current animation to be the previous one
        setCurrentAnimation(currentAnimationIndex - 1);
    }
}